

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::js::Generator::GenerateRequiresForLibrary
          (Generator *this,GeneratorOptions *options,Printer *printer,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *files,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *provided)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  FileDescriptor *pFVar4;
  Generator *pGVar5;
  Generator *extraout_RAX;
  byte bVar6;
  Descriptor *descriptor;
  uint uVar7;
  long lVar8;
  Generator *this_00;
  long lVar9;
  ulong uVar10;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *pvVar11;
  bool have_message;
  ulong local_120;
  Descriptor *local_118;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *local_110;
  GeneratorOptions *local_108;
  Generator *local_100;
  Printer *local_f8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_f0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  required;
  undefined1 local_b8 [32];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  forwards;
  LogMessage local_68;
  
  local_110 = files;
  local_108 = options;
  local_100 = this;
  if (options->import_style != kImportClosure) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
               ,0x710);
    options = (GeneratorOptions *)
              internal::LogMessage::operator<<
                        (&local_68,
                         "CHECK failed: (options.import_style) == (GeneratorOptions::kImportClosure): "
                        );
    internal::LogFinisher::operator=((LogFinisher *)&required,(LogMessage *)options);
    internal::LogMessage::~LogMessage(&local_68);
  }
  required._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &required._M_t._M_impl.super__Rb_tree_header._M_header;
  uVar7 = 0;
  required._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  required._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  required._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  forwards._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &forwards._M_t._M_impl.super__Rb_tree_header._M_header;
  forwards._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  forwards._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  forwards._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  have_message = false;
  required._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       required._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  forwards._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       forwards._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((local_110->
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (local_110->
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    bVar6 = 0;
  }
  else {
    uVar10 = 0;
    local_120 = 0;
    local_118 = (Descriptor *)0x0;
    pvVar11 = local_110;
    local_f8 = printer;
    local_f0 = provided;
    do {
      pGVar5 = local_100;
      pFVar4 = (pvVar11->
               super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_start[uVar10];
      if (0 < *(int *)(pFVar4 + 0x2c)) {
        lVar9 = 0;
        lVar8 = 0;
        do {
          if (*(char *)(*(long *)(*(long *)(pFVar4 + 0x68) + 0x20 + lVar9) + 0x4b) == '\0') {
            options = local_108;
            FindRequiresForMessage
                      (pGVar5,local_108,(Descriptor *)(*(long *)(pFVar4 + 0x68) + lVar9),&required,
                       &forwards,&have_message);
          }
          lVar8 = lVar8 + 1;
          pFVar4 = (pvVar11->
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar10];
          lVar9 = lVar9 + 0x90;
        } while (lVar8 < *(int *)(pFVar4 + 0x2c));
      }
      descriptor = local_118;
      if (((ulong)local_118 & 1) == 0) {
        if (0 < *(int *)(pFVar4 + 0x38)) {
          bVar3 = true;
          lVar8 = 0;
          lVar9 = 0;
          do {
            if ((*(char *)(*(long *)(pFVar4 + 0x80) + 0x42 + lVar8) == '\x01') &&
               (bVar2 = anon_unknown_0::IgnoreField
                                  ((FieldDescriptor *)(*(long *)(pFVar4 + 0x80) + lVar8)), !bVar2))
            {
              bVar2 = true;
              if (bVar3) goto LAB_00244be7;
              break;
            }
            lVar9 = lVar9 + 1;
            lVar8 = lVar8 + 0x98;
            bVar3 = lVar9 < *(int *)(pFVar4 + 0x38);
          } while (lVar9 < *(int *)(pFVar4 + 0x38));
        }
        bVar2 = 0 < *(int *)(pFVar4 + 0x2c);
        if (0 < *(int *)(pFVar4 + 0x2c)) {
          bVar3 = anon_unknown_0::HasExtensions(*(Descriptor **)(pFVar4 + 0x68));
          bVar2 = true;
          if (!bVar3) {
            lVar9 = 0;
            lVar8 = 0x90;
            do {
              lVar9 = lVar9 + 1;
              bVar2 = lVar9 < *(int *)(pFVar4 + 0x2c);
              if (*(int *)(pFVar4 + 0x2c) <= lVar9) break;
              bVar3 = anon_unknown_0::HasExtensions
                                ((Descriptor *)(lVar8 + *(long *)(pFVar4 + 0x68)));
              lVar8 = lVar8 + 0x90;
            } while (!bVar3);
          }
        }
LAB_00244be7:
        descriptor = (Descriptor *)((ulong)local_118 & 0xff);
        pvVar11 = local_110;
        if (bVar2) {
          descriptor = (Descriptor *)0x1;
        }
      }
      local_118 = descriptor;
      if ((local_120 & 1) == 0) {
        pFVar4 = (pvVar11->
                 super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start[uVar10];
        bVar3 = 0 < *(int *)(pFVar4 + 0x2c);
        if (0 < *(int *)(pFVar4 + 0x2c)) {
          bVar3 = true;
          lVar9 = 0;
          lVar8 = 0;
          do {
            bVar2 = anon_unknown_0::HasMap
                              ((GeneratorOptions *)(*(long *)(pFVar4 + 0x68) + lVar9),
                               (Descriptor *)options);
            if (bVar2) break;
            lVar8 = lVar8 + 1;
            lVar9 = lVar9 + 0x90;
            bVar3 = lVar8 < *(int *)(pFVar4 + 0x2c);
          } while (lVar8 < *(int *)(pFVar4 + 0x2c));
        }
        local_120 = local_120 & 0xff;
        descriptor = (Descriptor *)0x1;
        if (bVar3) {
          local_120 = 1;
        }
      }
      pFVar4 = (pvVar11->
               super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_start[uVar10];
      if (0 < *(int *)(pFVar4 + 0x38)) {
        lVar8 = 0;
        lVar9 = 0;
        do {
          lVar1 = *(long *)(pFVar4 + 0x80);
          bVar3 = anon_unknown_0::IgnoreField((FieldDescriptor *)(lVar1 + lVar8));
          if (!bVar3) {
            this_00 = *(Generator **)(*(long *)(lVar1 + 0x50 + lVar8) + 8);
            pGVar5 = (Generator *)std::__cxx11::string::compare((char *)this_00);
            if ((int)pGVar5 != 0) {
              (anonymous_namespace)::GetMessagePath_abi_cxx11_
                        ((string *)local_b8,(_anonymous_namespace_ *)local_108,
                         *(GeneratorOptions **)(lVar1 + 0x50 + lVar8),descriptor);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&required,(string *)local_b8);
              pGVar5 = (Generator *)(local_b8 + 0x10);
              this_00 = (Generator *)local_b8._0_8_;
              if ((Generator *)local_b8._0_8_ != pGVar5) {
                operator_delete((void *)local_b8._0_8_);
                pGVar5 = extraout_RAX;
              }
            }
            local_118 = (Descriptor *)CONCAT71((int7)((ulong)pGVar5 >> 8),1);
            options = local_108;
            FindRequiresForField
                      (this_00,local_108,(FieldDescriptor *)(lVar1 + lVar8),&required,&forwards);
          }
          lVar9 = lVar9 + 1;
          pFVar4 = (pvVar11->
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar10];
          descriptor = (Descriptor *)(long)*(int *)(pFVar4 + 0x38);
          lVar8 = lVar8 + 0x98;
        } while (lVar9 < (long)descriptor);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)((long)(pvVar11->
                                    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pvVar11->
                                    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
    bVar6 = (byte)local_120;
    uVar7 = (uint)local_118;
    provided = local_f0;
    printer = local_f8;
  }
  GenerateRequiresImpl
            ((Generator *)(ulong)(uVar7 & 1),(GeneratorOptions *)(ulong)(bVar6 & 1),printer,
             &required,&forwards,provided,have_message,SUB41(uVar7 & 1,0),SUB41(bVar6 & 1,0));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&forwards._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&required._M_t);
  return;
}

Assistant:

void Generator::GenerateRequiresForLibrary(
    const GeneratorOptions& options, io::Printer* printer,
    const std::vector<const FileDescriptor*>& files,
    std::set<std::string>* provided) const {
  GOOGLE_CHECK_EQ(options.import_style, GeneratorOptions::kImportClosure);
  // For Closure imports we need to import every message type individually.
  std::set<std::string> required;
  std::set<std::string> forwards;
  bool have_extensions = false;
  bool have_map = false;
  bool have_message = false;

  for (int i = 0; i < files.size(); i++) {
    for (int j = 0; j < files[i]->message_type_count(); j++) {
      const Descriptor* desc = files[i]->message_type(j);
      if (!IgnoreMessage(desc)) {
        FindRequiresForMessage(options, desc, &required, &forwards,
                               &have_message);
      }
    }

    if (!have_extensions && HasExtensions(files[i])) {
      have_extensions = true;
    }

    if (!have_map && FileHasMap(options, files[i])) {
      have_map = true;
    }

    for (int j = 0; j < files[i]->extension_count(); j++) {
      const FieldDescriptor* extension = files[i]->extension(j);
      if (IgnoreField(extension)) {
        continue;
      }
      if (extension->containing_type()->full_name() !=
          "google.protobuf.bridge.MessageSet") {
        required.insert(GetMessagePath(options, extension->containing_type()));
      }
      FindRequiresForField(options, extension, &required, &forwards);
      have_extensions = true;
    }
  }

  GenerateRequiresImpl(options, printer, &required, &forwards, provided,
                       /* require_jspb = */ have_message,
                       /* require_extension = */ have_extensions,
                       /* require_map = */ have_map);
}